

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O1

int qc_list_removefirst(QcList *list,void *data)

{
  QcListEntry *pQVar1;
  int iVar2;
  QcListEntry *cur;
  QcListEntry *pQVar3;
  QcList *pQVar4;
  QcList *pQVar5;
  int iVar6;
  QcList *pQVar7;
  QcList *pQVar8;
  
  if (list != (QcList *)0x0) {
    pQVar3 = list->head;
    list->cur = pQVar3;
    if (pQVar3 == (QcListEntry *)0x0) {
      pQVar3 = (QcListEntry *)0x0;
    }
    else {
      list->cur = pQVar3->next;
    }
    while( true ) {
      if (pQVar3 == (QcListEntry *)0x0) {
        return -1;
      }
      if (pQVar3->data == data) break;
      pQVar3 = list->cur;
      if (pQVar3 == (QcListEntry *)0x0) {
        pQVar3 = (QcListEntry *)0x0;
      }
      else {
        list->cur = pQVar3->next;
      }
    }
    qc_list_removeentry(list,pQVar3);
    return 0;
  }
  qc_list_removefirst_cold_1();
  pQVar7 = (QcList *)list->head;
  if (pQVar7 == (QcList *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = 1;
    pQVar3 = pQVar7->head;
    while (pQVar3 != (QcListEntry *)0x0) {
      pQVar4 = list;
      pQVar5 = (QcList *)0x0;
      do {
        pQVar8 = pQVar5;
        pQVar4 = (QcList *)pQVar4->head;
        if (pQVar4 == (QcList *)pQVar7->head) goto LAB_001063c8;
        iVar2 = (*(code *)data)(((QcList *)pQVar7->head)->cur,pQVar4->cur);
        pQVar5 = pQVar4;
      } while (-1 < iVar2);
      pQVar3 = pQVar7->head;
      pQVar1 = pQVar3->next;
      pQVar7->head = pQVar1;
      if (pQVar1 != (QcListEntry *)0x0) {
        pQVar1->prev = (QcListEntry *)pQVar7;
      }
      if (pQVar8 == (QcList *)0x0) {
        pQVar3->next = (QcListEntry *)pQVar4;
        pQVar3->prev = (QcListEntry *)0x0;
        list->head->prev = pQVar3;
        pQVar5 = list;
      }
      else {
        pQVar8->head = pQVar3;
        pQVar3->prev = (QcListEntry *)pQVar8;
        pQVar3->next = (QcListEntry *)pQVar4;
        pQVar5 = (QcList *)&pQVar4->tail;
      }
      pQVar5->head = pQVar3;
      if (pQVar3 == list->tail) {
        list->tail = (QcListEntry *)pQVar7;
      }
LAB_001063c8:
      if (pQVar4 == (QcList *)pQVar7->head) {
        pQVar7 = (QcList *)pQVar7->head;
      }
      pQVar3 = pQVar7->head;
    }
  }
  return iVar6;
}

Assistant:

int qc_list_removefirst(QcList *list, void *data){
    QcListEntry *entry = NULL;
    qc_assert(list);

    qc_list_enumbegin(list);

    entry = qc_list_enumentry(list);
    while(entry){
        if(entry->data == data){
            qc_list_removeentry(list, entry);
            return 0;
        }
        entry = qc_list_enumentry(list);
    }

    return -1;
}